

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O2

int setup_container_add_offset_test(void **state_)

{
  char cVar1;
  ushort uVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  size_t i;
  run_container_t *run;
  long lVar8;
  array_container_t *container;
  ulong uVar9;
  size_t i_1;
  int lenarray;
  size_t i_2;
  
  pvVar3 = *state_;
  lVar4 = *(long *)((long)pvVar3 + 8);
  lVar5 = *(long *)((long)pvVar3 + 0x10);
  cVar1 = *(char *)((long)pvVar3 + 0x1a);
  if (cVar1 == '\x03') {
    run = run_container_create();
    _assert_true((ulong)(run != (run_container_t *)0x0),"rc != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x3d);
    for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
      run_container_add(run,*(uint16_t *)(lVar4 + lVar8 * 2));
    }
  }
  else {
    if (cVar1 == '\x02') {
      container = array_container_create();
      _assert_true((ulong)(container != (array_container_t *)0x0),"ac != NULL",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x35);
      for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
        uVar2 = *(ushort *)(lVar4 + lVar8 * 2);
        lenarray = container->cardinality;
        if (((long)lenarray == 0) ||
           ((lenarray != 0x7fffffff && (container->array[(long)lenarray + -1] < uVar2)))) {
          if (lenarray == container->capacity) {
            array_container_grow(container,lenarray + 1,true);
            lenarray = container->cardinality;
          }
          container->cardinality = lenarray + 1;
          container->array[lenarray] = uVar2;
        }
        else {
          uVar7 = binarySearch(container->array,lenarray,uVar2);
          if ((lenarray != 0x7fffffff) && ((int)uVar7 < 0)) {
            if (container->cardinality == container->capacity) {
              array_container_grow(container,container->cardinality + 1,true);
            }
            uVar7 = ~uVar7;
            memmove(container->array + (ulong)uVar7 + 1,container->array + uVar7,
                    (long)(int)(lenarray - uVar7) * 2);
            container->array[uVar7] = uVar2;
            container->cardinality = container->cardinality + 1;
          }
        }
      }
      *(array_container_t **)((long)pvVar3 + 0x20) = container;
      return 0;
    }
    if (cVar1 != '\x01') {
      _assert_true(0,"false",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                   ,0x44);
      return 0;
    }
    run = (run_container_t *)bitset_container_create();
    _assert_true((ulong)(run != (run_container_t *)0x0),"bc != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/add_offset.c"
                 ,0x2d);
    for (lVar8 = 0; lVar5 != lVar8; lVar8 = lVar8 + 1) {
      uVar2 = *(ushort *)(lVar4 + lVar8 * 2);
      uVar6 = *(ulong *)(run->runs + (ulong)(uVar2 >> 6) * 2);
      uVar9 = uVar6 | 1L << ((ulong)uVar2 & 0x3f);
      run->n_runs = run->n_runs + (int)((uVar6 ^ uVar9) >> ((byte)uVar2 & 0x3f));
      *(ulong *)(run->runs + (ulong)(uVar2 >> 6) * 2) = uVar9;
    }
  }
  *(run_container_t **)((long)pvVar3 + 0x20) = run;
  return 0;
}

Assistant:

static int setup_container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    bitset_container_t *bc;
    array_container_t *ac;
    run_container_t *rc;

    switch (test.type) {
        case BITSET_CONTAINER_TYPE:
            bc = bitset_container_create();
            assert_true(bc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                bitset_container_add(bc, test.values[i]);
            }
            state->in = bc;
            break;
        case ARRAY_CONTAINER_TYPE:
            ac = array_container_create();
            assert_true(ac != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                array_container_add(ac, test.values[i]);
            }
            state->in = ac;
            break;
        case RUN_CONTAINER_TYPE:
            rc = run_container_create();
            assert_true(rc != NULL);
            for (size_t i = 0; i < test.n_values; i++) {
                run_container_add(rc, test.values[i]);
            }
            state->in = rc;
            break;
        default:
            assert_true(false);  // To catch buggy tests.
    }

    return 0;
}